

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

void zng_flush_pending(zng_stream *strm)

{
  uint32_t *puVar1;
  deflate_state *s;
  uint uVar2;
  ulong __n;
  
  s = strm->state;
  zng_tr_flush_bits(s);
  uVar2 = strm->avail_out;
  if (s->pending < strm->avail_out) {
    uVar2 = s->pending;
  }
  if (uVar2 != 0) {
    __n = (ulong)uVar2;
    memcpy(strm->next_out,s->pending_out,__n);
    strm->next_out = strm->next_out + __n;
    s->pending_out = s->pending_out + __n;
    strm->total_out = strm->total_out + __n;
    strm->avail_out = strm->avail_out - uVar2;
    puVar1 = &s->pending;
    *puVar1 = *puVar1 - uVar2;
    if (*puVar1 == 0) {
      s->pending_out = s->pending_buf;
    }
  }
  return;
}

Assistant:

Z_INTERNAL void PREFIX(flush_pending)(PREFIX3(stream) *strm) {
    uint32_t len;
    deflate_state *s = strm->state;

    zng_tr_flush_bits(s);
    len = MIN(s->pending, strm->avail_out);
    if (len == 0)
        return;

    Tracev((stderr, "[FLUSH]"));
    memcpy(strm->next_out, s->pending_out, len);
    strm->next_out  += len;
    s->pending_out  += len;
    strm->total_out += len;
    strm->avail_out -= len;
    s->pending      -= len;
    if (s->pending == 0)
        s->pending_out = s->pending_buf;
}